

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O2

function<void_()> * __thiscall
Console::bindCallback<std::__cxx11::string>
          (function<void_()> *__return_storage_ptr__,Console *this,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,int argumentIndex)

{
  const_reference pvVar1;
  function<void_()> nextCallback;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  _Any_data local_b0;
  _Manager_type local_a0;
  _Invoker_type p_Stack_98;
  function<void_()> local_90;
  string local_70 [32];
  undefined1 local_50 [64];
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)callback,(long)(int)arguments);
  std::__cxx11::string::string(local_70,(string *)pvVar1);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)local_50,
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)this);
  std::__cxx11::string::string((string *)(local_50 + 0x20),local_70);
  std::function<void()>::
  function<Console::bindCallback<std::__cxx11::string>(std::function<void(std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)::_lambda()_1_,void>
            ((function<void()> *)&local_90,(anon_class_64_2_4fe94ccd *)local_50);
  bindCallback<std::__cxx11::string>(std::function<void(std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)
  ::{lambda()#1}::~vector((_lambda___1_ *)local_50);
  std::function<void_()>::function((function<void_()> *)&local_b0,&local_90);
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = p_Stack_98;
  if (local_a0 != (_Manager_type)0x0) {
    *(void **)&(__return_storage_ptr__->super__Function_base)._M_functor =
         local_b0._M_unused._M_object;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) =
         local_b0._8_8_;
    (__return_storage_ptr__->super__Function_base)._M_manager = local_a0;
    local_a0 = (_Manager_type)0x0;
    p_Stack_98 = (_Invoker_type)0x0;
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  std::__cxx11::string::~string(local_70);
  return __return_storage_ptr__;
}

Assistant:

std::function<void()> Console::bindCallback(std::function<void(T, Args...)> callback, const std::vector<std::string> &arguments, int argumentIndex)
{
    T value = argumentConverter<T>::convert(arguments.at(argumentIndex));
    std::function<void(Args...)> nextCallback = [callback, value](Args... args) {
        callback(value, args...);
    };
    return bindCallback(nextCallback, arguments, argumentIndex + 1);
}